

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O0

int av1_return_max_sub_pixel_mv
              (MACROBLOCKD *xd,AV1_COMMON *cm,SUBPEL_MOTION_SEARCH_PARAMS *ms_params,MV start_mv,
              FULLPEL_MV_STATS *start_mv_stats,MV *bestmv,int *distortion,uint *sse1,
              int_mv *last_mv_search_list)

{
  long in_RDX;
  undefined2 *in_R9;
  uint besterr;
  SubpelMvLimits *mv_limits;
  int *in_stack_00000010;
  int allow_hp;
  int in_stack_ffffffffffffffb8;
  int iVar1;
  
  *in_R9 = (short)*(undefined4 *)(in_RDX + 0x24);
  in_R9[1] = (short)*(undefined4 *)(in_RDX + 0x1c);
  iVar1 = 0;
  lower_mv_precision((MV *)(in_RDX + 0x18),0,in_stack_ffffffffffffffb8);
  *in_stack_00000010 = iVar1;
  return iVar1;
}

Assistant:

int av1_return_max_sub_pixel_mv(MACROBLOCKD *xd, const AV1_COMMON *const cm,
                                const SUBPEL_MOTION_SEARCH_PARAMS *ms_params,
                                MV start_mv,
                                const FULLPEL_MV_STATS *start_mv_stats,
                                MV *bestmv, int *distortion, unsigned int *sse1,
                                int_mv *last_mv_search_list) {
  (void)xd;
  (void)cm;
  (void)start_mv;
  (void)start_mv_stats;
  (void)distortion;
  (void)last_mv_search_list;

  const int allow_hp = ms_params->allow_hp;
  const SubpelMvLimits *mv_limits = &ms_params->mv_limits;

  bestmv->row = mv_limits->row_max;
  bestmv->col = mv_limits->col_max;

  unsigned int besterr = 0;

  // In the sub-pel motion search, if hp is not used, then the last bit of mv
  // has to be 0.
  lower_mv_precision(bestmv, allow_hp, 0);
  *sse1 = besterr;
  return besterr;
}